

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_setClockSource(SoapySDRDevice *device,char *source)

{
  undefined1 *puVar1;
  allocator local_31;
  string local_30 [32];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_30,source,&local_31);
  (**(code **)(*(long *)device + 0x240))(device,local_30);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int SoapySDRDevice_setClockSource(SoapySDRDevice *device, const char *source)
{
    __SOAPY_SDR_C_TRY
    device->setClockSource(source);
    __SOAPY_SDR_C_CATCH
}